

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

int mkroll_launch(trap *ttmp,level *lev,xchar x,xchar y,short otyp,long ocount)

{
  char dx_00;
  char dy_00;
  xchar xVar1;
  xchar xVar2;
  xchar xVar3;
  boolean bVar4;
  int iVar5;
  uint uVar6;
  obj *obj;
  int local_4c;
  boolean success_otherway;
  int mindist;
  coord local_40;
  xchar local_3e;
  boolean success;
  int trycount;
  coord bcc;
  coord cc;
  int distance;
  schar dy;
  schar dx;
  int tmp;
  obj *otmp;
  long ocount_local;
  short otyp_local;
  xchar y_local;
  xchar x_local;
  level *lev_local;
  trap *ttmp_local;
  
  mindist = 0;
  success_otherway = '\0';
  local_4c = 4;
  if ((ttmp->field_0x8 & 0x1f) == 7) {
    local_4c = 2;
  }
  iVar5 = rn2(5);
  trycount = iVar5 + 4;
  distance = rn2(8);
  while (local_4c <= trycount) {
    dx_00 = xdir[distance];
    dy_00 = ""[distance];
    local_3e = x;
    success = y;
    if (((ttmp->field_0x8 & 0x1f) == 7) &&
       ((bVar4 = is_pool(lev,(int)x + trycount * dx_00,(int)y + trycount * dy_00), bVar4 != '\0' ||
        (bVar4 = is_lava(lev,(int)x + trycount * dx_00,(int)y + trycount * dy_00), bVar4 != '\0'))))
    {
      success_otherway = '\0';
    }
    else {
      success_otherway = isclearpath(lev,(coord *)&stack0xffffffffffffffc2,trycount,dx_00,dy_00);
    }
    if (((ttmp->field_0x8 & 0x1f) == 7) &&
       (local_40.x = x, local_40.y = y, bVar4 = isclearpath(lev,&local_40,trycount,-dx_00,-dy_00),
       bVar4 == '\0')) {
      success_otherway = '\0';
    }
    if (success_otherway != '\0') break;
    distance = distance + 1;
    if (7 < distance) {
      distance = 0;
    }
    mindist = mindist + 1;
    if (mindist % 8 == 0) {
      trycount = trycount + -1;
    }
  }
  xVar1 = x;
  xVar2 = y;
  xVar3 = x;
  bVar4 = y;
  if (success_otherway != '\0') {
    obj = mksobj(lev,(int)otyp,'\x01','\0');
    obj->quan = (int)ocount;
    uVar6 = weight(obj);
    obj->owt = uVar6;
    place_object(obj,lev,(int)local_3e,(int)success);
    stackobj(obj);
    xVar1 = local_40.x;
    xVar2 = local_40.y;
    xVar3 = local_3e;
    bVar4 = success;
  }
  success = bVar4;
  local_3e = xVar3;
  local_40.y = xVar2;
  local_40.x = xVar1;
  (ttmp->launch).x = local_3e;
  (ttmp->launch).y = success;
  if ((ttmp->field_0x8 & 0x1f) == 7) {
    (ttmp->vl).v_launch2.x = local_40.x;
    (ttmp->vl).v_launch2.y = local_40.y;
  }
  else {
    (ttmp->vl).v_launch_otyp = otyp;
  }
  newsym((int)(ttmp->launch).x,(int)(ttmp->launch).y);
  return 1;
}

Assistant:

static int mkroll_launch(struct trap *ttmp, struct level *lev, xchar x, xchar y,
			 short otyp, long ocount)
{
	struct obj *otmp;
	int tmp;
	schar dx,dy;
	int distance;
	coord cc;
	coord bcc;
	int trycount = 0;
	boolean success = FALSE;
	int mindist = 4;

	if (ttmp->ttyp == ROLLING_BOULDER_TRAP) mindist = 2;
	distance = rn1(5,4);    /* 4..8 away */
	tmp = rn2(8);		/* randomly pick a direction to try first */
	while (distance >= mindist) {
		dx = xdir[tmp];
		dy = ydir[tmp];
		cc.x = x; cc.y = y;
		/* Prevent boulder from being placed on water or lava. */
		if (ttmp->ttyp == ROLLING_BOULDER_TRAP
				&& (is_pool(lev, x+distance*dx,y+distance*dy) ||
				    is_lava(lev, x+distance*dx,y+distance*dy)))
			success = FALSE;
		else success = isclearpath(lev, &cc, distance, dx, dy);
		if (ttmp->ttyp == ROLLING_BOULDER_TRAP) {
			boolean success_otherway;
			bcc.x = x; bcc.y = y;
			success_otherway = isclearpath(lev, &bcc, distance,
						-(dx), -(dy));
			if (!success_otherway) success = FALSE;
		}
		if (success) break;
		if (++tmp > 7) tmp = 0;
		if ((++trycount % 8) == 0) --distance;
	}
	if (!success) {
	    /* create the trap without any ammo, launch pt at trap location */
		cc.x = bcc.x = x;
		cc.y = bcc.y = y;
	} else {
		otmp = mksobj(lev, otyp, TRUE, FALSE);
		otmp->quan = ocount;
		otmp->owt = weight(otmp);
		place_object(otmp, lev, cc.x, cc.y);
		stackobj(otmp);
	}
	ttmp->launch.x = cc.x;
	ttmp->launch.y = cc.y;
	if (ttmp->ttyp == ROLLING_BOULDER_TRAP) {
		ttmp->launch2.x = bcc.x;
		ttmp->launch2.y = bcc.y;
	} else
		ttmp->launch_otyp = otyp;
	newsym(ttmp->launch.x, ttmp->launch.y);
	return 1;
}